

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O1

void __thiscall
xe::TcpIpRecvThread::handleMessage
          (TcpIpRecvThread *this,MessageType messageType,deUint8 *data,size_t dataSize)

{
  CommLinkState CVar1;
  Error *pEVar2;
  size_t numBytes;
  ProcessFinishedMessage msg;
  ProcessLaunchFailedMessage local_50;
  
  switch(messageType) {
  case MESSAGETYPE_PROCESS_STARTED:
    CVar1 = TcpIpLinkState::getState(this->m_state);
    if (CVar1 == COMMLINKSTATE_TEST_PROCESS_LAUNCHING) {
      TcpIpLinkState::setState(this->m_state,COMMLINKSTATE_TEST_PROCESS_RUNNING,"");
      return;
    }
    pEVar2 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar2,"Unexpected PROCESS_STARTED message",
                 "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,0x173);
    break;
  case MESSAGETYPE_PROCESS_LAUNCH_FAILED:
    xs::ProcessLaunchFailedMessage::ProcessLaunchFailedMessage(&local_50,data,dataSize);
    CVar1 = TcpIpLinkState::getState(this->m_state);
    if (CVar1 == COMMLINKSTATE_TEST_PROCESS_LAUNCHING) {
      TcpIpLinkState::setState
                (this->m_state,COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED,
                 local_50.reason._M_dataplus._M_p);
      local_50.super_Message._vptr_Message = (_func_int **)&PTR__ProcessLaunchFailedMessage_00151918
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.reason._M_dataplus._M_p != &local_50.reason.field_2) {
        operator_delete(local_50.reason._M_dataplus._M_p,
                        local_50.reason.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    pEVar2 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar2,"Unexpected PROCESS_LAUNCH_FAILED message",
                 "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,0x17a);
    __cxa_throw(pEVar2,&Error::typeinfo,std::runtime_error::~runtime_error);
  case MESSAGETYPE_PROCESS_FINISHED:
    CVar1 = TcpIpLinkState::getState(this->m_state);
    if (CVar1 == COMMLINKSTATE_TEST_PROCESS_RUNNING) {
      xs::ProcessFinishedMessage::ProcessFinishedMessage
                ((ProcessFinishedMessage *)&local_50,data,dataSize);
      TcpIpLinkState::setState(this->m_state,COMMLINKSTATE_TEST_PROCESS_FINISHED,"");
      return;
    }
    pEVar2 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar2,"Unexpected PROCESS_FINISHED message",
                 "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,0x181);
    break;
  case MESSAGETYPE_PROCESS_LOG_DATA:
  case MESSAGETYPE_INFO:
    numBytes = dataSize - 1;
    if (data[dataSize - 1] != '\0') {
      numBytes = dataSize;
    }
    if (messageType != MESSAGETYPE_PROCESS_LOG_DATA) {
      TcpIpLinkState::onInfoLogData(this->m_state,data,numBytes);
      return;
    }
    CVar1 = TcpIpLinkState::getState(this->m_state);
    if (CVar1 == COMMLINKSTATE_TEST_PROCESS_RUNNING) {
      TcpIpLinkState::onTestLogData(this->m_state,data,numBytes);
      return;
    }
    pEVar2 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar2,"Unexpected PROCESS_LOG_DATA message",
                 "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,400);
    break;
  default:
    if (messageType == MESSAGETYPE_KEEPALIVE) {
      TcpIpLinkState::onKeepaliveReceived(this->m_state);
      return;
    }
    pEVar2 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar2,"Unknown message","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,0x198);
  }
  __cxa_throw(pEVar2,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpIpRecvThread::handleMessage (xs::MessageType messageType, const deUint8* data, size_t dataSize)
{
	switch (messageType)
	{
		case xs::MESSAGETYPE_KEEPALIVE:
			m_state.onKeepaliveReceived();
			break;

		case xs::MESSAGETYPE_PROCESS_STARTED:
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING, "Unexpected PROCESS_STARTED message");
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_RUNNING);
			break;

		case xs::MESSAGETYPE_PROCESS_LAUNCH_FAILED:
		{
			xs::ProcessLaunchFailedMessage msg(data, dataSize);
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING, "Unexpected PROCESS_LAUNCH_FAILED message");
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED, msg.reason.c_str());
			break;
		}

		case xs::MESSAGETYPE_PROCESS_FINISHED:
		{
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING, "Unexpected PROCESS_FINISHED message");
			xs::ProcessFinishedMessage msg(data, dataSize);
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_FINISHED);
			DE_UNREF(msg); // \todo [2012-06-19 pyry] Report exit code.
			break;
		}

		case xs::MESSAGETYPE_PROCESS_LOG_DATA:
		case xs::MESSAGETYPE_INFO:
			// Ignore leading \0 if such is present. \todo [2012-06-19 pyry] Improve protocol.
			if (data[dataSize-1] == 0)
				dataSize -= 1;

			if (messageType == xs::MESSAGETYPE_PROCESS_LOG_DATA)
			{
				XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING, "Unexpected PROCESS_LOG_DATA message");
				m_state.onTestLogData(&data[0], dataSize);
			}
			else
				m_state.onInfoLogData(&data[0], dataSize);
			break;

		default:
			XE_FAIL("Unknown message");
	}
}